

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O2

void do_recite(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  OBJ_DATA *obj;
  CHAR_DATA *victim;
  CProficiencies *pCVar6;
  int iVar7;
  OBJ_DATA *local_2448;
  char arg2 [4608];
  char arg1 [4608];
  
  pcVar5 = one_argument(argument,arg1);
  one_argument(pcVar5,arg2);
  obj = get_obj_carry(ch,arg1,ch);
  if (obj == (OBJ_DATA *)0x0) {
    pcVar5 = "You do not have that scroll.\n\r";
  }
  else if (obj->item_type == 2) {
    if (((obj->pIndexData->vnum != 0x5c65) || (ch->cabal == 2)) || (bVar1 = is_immortal(ch), bVar1))
    {
      if (ch->level < obj->level) {
        pcVar5 = "This scroll is too complex for you to comprehend.\n\r";
      }
      else {
        if (ch->fighting == (CHAR_DATA *)0x0) {
          iVar2 = 0;
          if (arg2[0] == '\0') {
            local_2448 = (OBJ_DATA *)0x0;
            victim = ch;
          }
          else {
            victim = get_char_room(ch,arg2);
            local_2448 = get_obj_here(ch,arg2);
            if (victim == (CHAR_DATA *)0x0 && local_2448 == (OBJ_DATA *)0x0) {
              pcVar5 = "You can\'t find it.\n\r";
              goto LAB_002be8fb;
            }
          }
          bVar1 = is_npc(ch);
          if (!bVar1) {
            if (ch->pcdata == (PC_DATA *)0x0) {
              pCVar6 = &prof_none;
            }
            else {
              pCVar6 = &ch->pcdata->profs;
            }
            iVar2 = CProficiencies::GetProf(pCVar6,"ancient languages");
            if (-1 < iVar2) {
              send_to_char("With your knowledge of ancient languages, you better understand the invocation of the scroll.\n\r"
                           ,ch);
              if (ch->pcdata == (PC_DATA *)0x0) {
                pCVar6 = &prof_none;
              }
              else {
                pCVar6 = &ch->pcdata->profs;
              }
              CProficiencies::CheckImprove(pCVar6,"ancient languages",100);
            }
          }
          act("$n recites $p.",ch,obj,(void *)0x0,0);
          act("You recite $p.",ch,obj,(void *)0x0,3);
          iVar3 = number_percent();
          iVar4 = get_skill(ch,(int)gsn_scrolls);
          iVar7 = 0;
          if (0 < iVar2 * 3) {
            iVar7 = iVar2 * 3;
          }
          iVar7 = iVar7 + (iVar4 << 2) / 5 + 0xf;
          if (iVar3 < iVar7) {
            bVar1 = check_deny_magic(ch);
            if (!bVar1) {
              iVar4 = 3;
              if (iVar2 < 3) {
                iVar4 = iVar2;
              }
              if (iVar4 < 1) {
                iVar4 = 0;
              }
              obj_cast_spell(obj->value[1],iVar4 + obj->value[0],ch,victim,local_2448);
              iVar4 = 2;
              if (iVar2 < 2) {
                iVar4 = iVar2;
              }
              if (iVar4 < 1) {
                iVar4 = 0;
              }
              obj_cast_spell(obj->value[2],iVar4 + obj->value[0],ch,victim,local_2448);
              obj_cast_spell(obj->value[3],(uint)(0 < iVar2) + obj->value[0],ch,victim,local_2448);
            }
          }
          else {
            send_to_char("You mispronounce a syllable.\n\r",ch);
          }
          check_improve(ch,(int)gsn_scrolls,iVar3 < iVar7,2);
          extract_obj(obj);
          return;
        }
        pcVar5 = "You\'re too busy fighting to recite.\n\r";
      }
    }
    else {
      pcVar5 = "You fail to understand the arcane symbols.\n\r";
    }
  }
  else {
    pcVar5 = "You can recite only scrolls.\n\r";
  }
LAB_002be8fb:
  send_to_char(pcVar5,ch);
  return;
}

Assistant:

void do_recite(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	OBJ_DATA *scroll;
	OBJ_DATA *obj;
	int alangbonus = 0;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	scroll = get_obj_carry(ch, arg1, ch);

	if (scroll == nullptr)
	{
		send_to_char("You do not have that scroll.\n\r", ch);
		return;
	}

	if (scroll->item_type != ITEM_SCROLL)
	{
		send_to_char("You can recite only scrolls.\n\r", ch);
		return;
	}

	if (scroll->pIndexData->vnum == OBJ_VNUM_SCRIBE
		&& ch->cabal != CABAL_SCION
		&& !is_immortal(ch))
	{
		send_to_char("You fail to understand the arcane symbols.\n\r", ch);
		return;
	}

	if (ch->level < scroll->level)
	{
		send_to_char("This scroll is too complex for you to comprehend.\n\r", ch);
		return;
	}

	if (ch->fighting != nullptr)
	{
		send_to_char("You're too busy fighting to recite.\n\r", ch);
		return;
	}

	obj = nullptr;

	if (arg2[0] == '\0')
	{
		victim = ch;
	}
	else
	{
		victim = get_char_room(ch, arg2);
		obj = get_obj_here(ch, arg2);

		if (victim == nullptr && obj == nullptr)
		{
			send_to_char("You can't find it.\n\r", ch);
			return;
		}
	}

	if (!is_npc(ch))
	{
		alangbonus = ch->Profs()->GetProf("ancient languages");

		if(alangbonus > -1)
		{
			send_to_char("With your knowledge of ancient languages, you better understand the invocation of the scroll.\n\r", ch);
			ch->Profs()->CheckImprove("ancient languages", 100);
		}
	}

	act("$n recites $p.", ch, scroll, nullptr, TO_ROOM);
	act("You recite $p.", ch, scroll, nullptr, TO_CHAR);

	if (number_percent() >= 15 + get_skill(ch, gsn_scrolls) * 4 / 5 + std::max(0, alangbonus * 3))
	{
		send_to_char("You mispronounce a syllable.\n\r", ch);
		check_improve(ch, gsn_scrolls, false, 2);
	}
	else
	{
		if (!check_deny_magic(ch))
		{
			obj_cast_spell(scroll->value[1], scroll->value[0] + URANGE(0, alangbonus, 3), ch, victim, obj);
			obj_cast_spell(scroll->value[2], scroll->value[0] + URANGE(0, alangbonus, 2), ch, victim, obj);
			obj_cast_spell(scroll->value[3], scroll->value[0] + URANGE(0, alangbonus, 1), ch, victim, obj);
		}

		check_improve(ch, gsn_scrolls, true, 2);
	}

	extract_obj(scroll);
}